

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataHandler.hpp
# Opt level: O1

void __thiscall DataHandler::~DataHandler(DataHandler *this)

{
  pointer pcVar1;
  
  this->_vptr_DataHandler = (_func_int **)&PTR__DataHandler_00144b10;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->_namesMapping)._M_h);
  pcVar1 = (this->_pathToFiles)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_pathToFiles).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

virtual ~DataHandler()
	{
	}